

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O2

ALuint __thiscall
SampleConverter::convert
          (SampleConverter *this,void **src,ALuint *srcframes,void *dst,ALuint dstframes)

{
  anon_union_192_2_dde17770_for_FlexArray<SampleConverter::ChanSamples,_16UL>_3 *paVar1;
  int iVar2;
  ALuint AVar3;
  ALuint AVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  index_type iVar9;
  ulong uVar10;
  long lVar11;
  float *pfVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  size_t chan;
  float *pfVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  size_t samples;
  long lVar20;
  anon_union_192_2_dde17770_for_FlexArray<SampleConverter::ChanSamples,_16UL>_3 *paVar21;
  anon_union_192_2_dde17770_for_FlexArray<SampleConverter::ChanSamples,_16UL>_3 *__src;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  uint uVar25;
  size_t sVar26;
  ulong uVar27;
  undefined1 *puVar28;
  undefined2 *puVar29;
  ushort *puVar30;
  char *pcVar31;
  int *piVar32;
  float *pfVar33;
  bool bVar34;
  float fVar35;
  span<float,_18446744073709551615UL> sVar36;
  void *local_100;
  void *local_f8;
  FPUCtl mixer_mode;
  
  iVar2 = (int)(this->mChan).mSize;
  AVar3 = this->mSrcTypeSize;
  AVar4 = this->mDstTypeSize;
  uVar5 = this->mIncrement;
  local_f8 = *src;
  uVar25 = *srcframes;
  FPUCtl::FPUCtl(&mixer_mode);
  pfVar16 = this->mSrcSamples;
  paVar1 = &(this->mChan).field_1;
  uVar17 = 0;
  local_100 = dst;
  do {
    sVar26 = (size_t)uVar25;
    uVar22 = dstframes - uVar17;
    if ((dstframes < uVar17 || uVar22 == 0) || (uVar25 == 0)) goto LAB_0013b4c6;
    uVar6 = this->mSrcPrepCount;
    lVar20 = (long)(int)uVar6;
    if (lVar20 < 0) {
      uVar22 = -uVar6;
      if (uVar25 <= uVar22) goto LAB_0013b4bc;
      uVar25 = uVar6 + uVar25;
      this->mSrcPrepCount = 0;
    }
    else {
      samples = 0x3d0;
      if (uVar25 < 0x3d0) {
        samples = sVar26;
      }
      if ((uVar6 < 0x30) && ((uint)samples <= 0x30 - uVar6)) {
        pfVar16 = (float *)((long)paVar1 + lVar20 * 4);
        for (uVar10 = 0; uVar24 = (this->mChan).mSize, sVar26 = samples, uVar10 < uVar24;
            uVar10 = uVar10 + 1) {
          anon_unknown.dwarf_1130cc::LoadSamples
                    (pfVar16,(void *)(this->mSrcTypeSize * uVar10 + (long)local_f8),uVar24,
                     this->mSrcType,samples);
          pfVar16 = pfVar16 + 0x30;
        }
LAB_0013b4bc:
        this->mSrcPrepCount = (int)sVar26 + uVar6;
        uVar25 = 0;
LAB_0013b4c6:
        *src = local_f8;
        *srcframes = uVar25;
        FPUCtl::leave(&mixer_mode);
        return uVar17;
      }
      uVar7 = this->mFracOffset;
      uVar10 = (((lVar20 + samples) * 0x1000 + ((ulong)uVar5 - 0x30001)) - (ulong)uVar7) /
               (ulong)uVar5;
      uVar10 = uVar10 + (uVar10 == 0);
      if (0x3ff < uVar10) {
        uVar10 = 0x400;
      }
      uVar24 = (ulong)uVar22;
      if ((uint)uVar10 < uVar22) {
        uVar24 = uVar10 & 0xffffffff;
      }
      iVar23 = (int)uVar24;
      uVar13 = iVar23 * uVar5 + uVar7;
      uVar22 = uVar13 >> 0xc;
      uVar14 = (uint)samples + uVar6;
      uVar15 = uVar14 - uVar22;
      uVar19 = 0x30;
      if (uVar15 < 0x30) {
        uVar19 = uVar15;
      }
      paVar21 = paVar1;
      for (uVar10 = 0; uVar18 = (this->mChan).mSize, uVar10 < uVar18; uVar10 = uVar10 + 1) {
        __src = paVar1 + uVar10;
        uVar8 = this->mSrcTypeSize;
        uVar27 = (ulong)this->mDstTypeSize;
        if (uVar6 != 0) {
          memmove(pfVar16,__src,lVar20 << 2);
          uVar18 = (this->mChan).mSize;
        }
        anon_unknown.dwarf_1130cc::LoadSamples
                  (pfVar16 + lVar20,(void *)(uVar8 * uVar10 + (long)local_f8),uVar18,this->mSrcType,
                   samples);
        if (uVar22 < uVar14) {
          memmove(__src,pfVar16 + uVar22,(ulong)(uVar19 << 2));
          for (uVar18 = (ulong)(uVar19 << 2); uVar18 != 0xc0; uVar18 = uVar18 + 4) {
            *(undefined4 *)((long)__src + uVar18) = 0;
          }
        }
        else {
          for (lVar11 = -0xc0; lVar11 != 0; lVar11 = lVar11 + 4) {
            *(undefined4 *)((long)paVar21 + lVar11 + 0xc0) = 0;
          }
        }
        sVar36.mDataEnd = this->mDstSamples + uVar24;
        sVar36.mData = this->mDstSamples;
        pfVar12 = (*this->mResample)(&this->mState,this->mSrcSamples + 0x18,uVar7,uVar5,sVar36);
        if (this->mDstType < (DevFmtFloat|DevFmtUByte)) {
          iVar9 = (this->mChan).mSize;
          switch(this->mDstType) {
          case DevFmtByte:
            puVar28 = (undefined1 *)(uVar27 * uVar10 + (long)local_100);
            for (uVar18 = 0; uVar24 != uVar18; uVar18 = uVar18 + 1) {
              fVar35 = -128.0;
              if (-128.0 <= pfVar12[uVar18] * 128.0) {
                fVar35 = pfVar12[uVar18] * 128.0;
              }
              if (127.0 <= fVar35) {
                fVar35 = 127.0;
              }
              *puVar28 = (char)(int)ROUND(fVar35);
              puVar28 = puVar28 + iVar9;
            }
            break;
          case DevFmtUByte:
            pcVar31 = (char *)(uVar27 * uVar10 + (long)local_100);
            for (uVar18 = 0; uVar24 != uVar18; uVar18 = uVar18 + 1) {
              fVar35 = -128.0;
              if (-128.0 <= pfVar12[uVar18] * 128.0) {
                fVar35 = pfVar12[uVar18] * 128.0;
              }
              if (127.0 <= fVar35) {
                fVar35 = 127.0;
              }
              *pcVar31 = (char)(int)ROUND(fVar35) + -0x80;
              pcVar31 = pcVar31 + iVar9;
            }
            break;
          case DevFmtShort:
            puVar29 = (undefined2 *)(uVar27 * uVar10 + (long)local_100);
            for (uVar18 = 0; uVar24 != uVar18; uVar18 = uVar18 + 1) {
              fVar35 = -32768.0;
              if (-32768.0 <= pfVar12[uVar18] * 32768.0) {
                fVar35 = pfVar12[uVar18] * 32768.0;
              }
              if (32767.0 <= fVar35) {
                fVar35 = 32767.0;
              }
              *puVar29 = (short)(int)ROUND(fVar35);
              puVar29 = puVar29 + iVar9;
            }
            break;
          case DevFmtUShort:
            puVar30 = (ushort *)(uVar27 * uVar10 + (long)local_100);
            for (uVar18 = 0; uVar24 != uVar18; uVar18 = uVar18 + 1) {
              fVar35 = -32768.0;
              if (-32768.0 <= pfVar12[uVar18] * 32768.0) {
                fVar35 = pfVar12[uVar18] * 32768.0;
              }
              if (32767.0 <= fVar35) {
                fVar35 = 32767.0;
              }
              *puVar30 = (ushort)(int)ROUND(fVar35) ^ 0x8000;
              puVar30 = puVar30 + iVar9;
            }
            break;
          case DevFmtInt:
            piVar32 = (int *)(uVar27 * uVar10 + (long)local_100);
            for (uVar18 = 0; uVar24 != uVar18; uVar18 = uVar18 + 1) {
              fVar35 = -2.1474836e+09;
              if (-2.1474836e+09 <= pfVar12[uVar18] * 2.1474836e+09) {
                fVar35 = pfVar12[uVar18] * 2.1474836e+09;
              }
              if (2.1474835e+09 <= fVar35) {
                fVar35 = 2.1474835e+09;
              }
              *piVar32 = (int)ROUND(fVar35);
              piVar32 = piVar32 + iVar9;
            }
            break;
          case DevFmtUInt:
            piVar32 = (int *)(uVar27 * uVar10 + (long)local_100);
            for (uVar18 = 0; uVar24 != uVar18; uVar18 = uVar18 + 1) {
              fVar35 = -2.1474836e+09;
              if (-2.1474836e+09 <= pfVar12[uVar18] * 2.1474836e+09) {
                fVar35 = pfVar12[uVar18] * 2.1474836e+09;
              }
              if (2.1474835e+09 <= fVar35) {
                fVar35 = 2.1474835e+09;
              }
              *piVar32 = (int)ROUND(fVar35) + -0x80000000;
              piVar32 = piVar32 + iVar9;
            }
            break;
          case DevFmtFloat:
            pfVar33 = (float *)(uVar27 * uVar10 + (long)local_100);
            for (uVar18 = 0; uVar24 != uVar18; uVar18 = uVar18 + 1) {
              *pfVar33 = pfVar12[uVar18];
              pfVar33 = pfVar33 + iVar9;
            }
          }
        }
        paVar21 = paVar21 + 1;
      }
      if (0x2f < (int)uVar15) {
        uVar15 = 0x30;
      }
      this->mSrcPrepCount = uVar15;
      this->mFracOffset = uVar13 & 0xfff;
      bVar34 = uVar25 < uVar22;
      uVar25 = uVar25 - uVar22;
      if (bVar34) {
        uVar25 = 0;
      }
      local_100 = (void *)((long)local_100 + (ulong)(iVar2 * AVar4 * iVar23));
      uVar17 = uVar17 + iVar23;
    }
    local_f8 = (void *)((long)local_f8 + (ulong)(uVar22 * AVar3 * iVar2));
  } while( true );
}

Assistant:

ALuint SampleConverter::convert(const void **src, ALuint *srcframes, void *dst, ALuint dstframes)
{
    const ALuint SrcFrameSize{static_cast<ALuint>(mChan.size()) * mSrcTypeSize};
    const ALuint DstFrameSize{static_cast<ALuint>(mChan.size()) * mDstTypeSize};
    const ALuint increment{mIncrement};
    auto SamplesIn = static_cast<const al::byte*>(*src);
    ALuint NumSrcSamples{*srcframes};

    FPUCtl mixer_mode{};
    ALuint pos{0};
    while(pos < dstframes && NumSrcSamples > 0)
    {
        int prepcount{mSrcPrepCount};
        if(prepcount < 0)
        {
            /* Negative prepcount means we need to skip that many input samples. */
            if(static_cast<ALuint>(-prepcount) >= NumSrcSamples)
            {
                mSrcPrepCount = static_cast<int>(NumSrcSamples) + prepcount;
                NumSrcSamples = 0;
                break;
            }
            SamplesIn += SrcFrameSize*static_cast<ALuint>(-prepcount);
            NumSrcSamples -= static_cast<ALuint>(-prepcount);
            mSrcPrepCount = 0;
            continue;
        }
        ALuint toread{minu(NumSrcSamples, BUFFERSIZE - MAX_RESAMPLER_PADDING)};

        if(prepcount < MAX_RESAMPLER_PADDING
            && static_cast<ALuint>(MAX_RESAMPLER_PADDING - prepcount) >= toread)
        {
            /* Not enough input samples to generate an output sample. Store
             * what we're given for later.
             */
            for(size_t chan{0u};chan < mChan.size();chan++)
                LoadSamples(&mChan[chan].PrevSamples[prepcount], SamplesIn + mSrcTypeSize*chan,
                    mChan.size(), mSrcType, toread);

            mSrcPrepCount = prepcount + static_cast<int>(toread);
            NumSrcSamples = 0;
            break;
        }

        float *RESTRICT SrcData{mSrcSamples};
        float *RESTRICT DstData{mDstSamples};
        ALuint DataPosFrac{mFracOffset};
        auto DataSize64 = static_cast<uint64_t>(prepcount);
        DataSize64 += toread;
        DataSize64 -= MAX_RESAMPLER_PADDING;
        DataSize64 <<= MixerFracBits;
        DataSize64 -= DataPosFrac;

        /* If we have a full prep, we can generate at least one sample. */
        auto DstSize = static_cast<ALuint>(
            clampu64((DataSize64 + increment-1)/increment, 1, BUFFERSIZE));
        DstSize = minu(DstSize, dstframes-pos);

        for(size_t chan{0u};chan < mChan.size();chan++)
        {
            const al::byte *SrcSamples{SamplesIn + mSrcTypeSize*chan};
            al::byte *DstSamples = static_cast<al::byte*>(dst) + mDstTypeSize*chan;

            /* Load the previous samples into the source data first, then the
             * new samples from the input buffer.
             */
            std::copy_n(mChan[chan].PrevSamples, prepcount, SrcData);
            LoadSamples(SrcData + prepcount, SrcSamples, mChan.size(), mSrcType, toread);

            /* Store as many prep samples for next time as possible, given the
             * number of output samples being generated.
             */
            ALuint SrcDataEnd{(DstSize*increment + DataPosFrac)>>MixerFracBits};
            if(SrcDataEnd >= static_cast<ALuint>(prepcount)+toread)
                std::fill(std::begin(mChan[chan].PrevSamples),
                    std::end(mChan[chan].PrevSamples), 0.0f);
            else
            {
                const size_t len{minz(al::size(mChan[chan].PrevSamples),
                    static_cast<ALuint>(prepcount)+toread-SrcDataEnd)};
                std::copy_n(SrcData+SrcDataEnd, len, mChan[chan].PrevSamples);
                std::fill(std::begin(mChan[chan].PrevSamples)+len,
                    std::end(mChan[chan].PrevSamples), 0.0f);
            }

            /* Now resample, and store the result in the output buffer. */
            const float *ResampledData{mResample(&mState, SrcData+(MAX_RESAMPLER_PADDING>>1),
                DataPosFrac, increment, {DstData, DstSize})};

            StoreSamples(DstSamples, ResampledData, mChan.size(), mDstType, DstSize);
        }

        /* Update the number of prep samples still available, as well as the
         * fractional offset.
         */
        DataPosFrac += increment*DstSize;
        mSrcPrepCount = mini(prepcount + static_cast<int>(toread - (DataPosFrac>>MixerFracBits)),
            MAX_RESAMPLER_PADDING);
        mFracOffset = DataPosFrac & MixerFracMask;

        /* Update the src and dst pointers in case there's still more to do. */
        SamplesIn += SrcFrameSize*(DataPosFrac>>MixerFracBits);
        NumSrcSamples -= minu(NumSrcSamples, (DataPosFrac>>MixerFracBits));

        dst = static_cast<al::byte*>(dst) + DstFrameSize*DstSize;
        pos += DstSize;
    }

    *src = SamplesIn;
    *srcframes = NumSrcSamples;

    return pos;
}